

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O1

bool CGL::SceneObjects::is_valid_intersection(Vector3D *t_b1_b2,Ray *r)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  
  dVar1 = (t_b1_b2->field_0).field_0.x;
  bVar3 = false;
  if ((r->min_t <= dVar1) && (bVar3 = false, dVar1 <= r->max_t)) {
    dVar1 = (t_b1_b2->field_0).field_0.y;
    bVar3 = false;
    if ((0.0 <= dVar1) && (dVar1 <= 1.0)) {
      dVar2 = (t_b1_b2->field_0).field_0.z;
      bVar3 = false;
      if ((0.0 <= dVar2) && (dVar2 <= 1.0)) {
        bVar3 = dVar1 + dVar2 <= 1.0;
      }
    }
  }
  return bVar3;
}

Assistant:

bool is_valid_intersection(Vector3D &t_b1_b2, const Ray &r) {
    double t = t_b1_b2.x;

    if (t < r.min_t || t > r.max_t) {
        return false;
    }

    double b1 = t_b1_b2.y;
    double b2 = t_b1_b2.z;

    if (b1 < 0 || b1 > 1) {
        return false;
    } else if (b2 < 0 || b2 > 1) {
        return false;
    }

    // at this point, we know 0 <= b1 <= 1 and 0 <= b2 <= 1
    // now need to test validity of b0
    if (b1 + b2 > 1) {
        return false;
    }

    return true;
}